

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::JitAllocatorBlock::JitAllocatorBlock
          (JitAllocatorBlock *this,JitAllocatorPool *pool,DualMapping mapping,size_t blockSize,
          uint32_t blockFlags,BitWord *usedBitVector,BitWord *stopBitVector,uint32_t areaSize)

{
  void *in_RCX;
  undefined8 in_RDX;
  JitAllocatorPool *in_RSI;
  JitAllocatorBlock *in_RDI;
  size_t in_R8;
  uint32_t in_R9D;
  BitWord *in_stack_00000008;
  BitWord *in_stack_00000010;
  uint32_t in_stack_00000018;
  JitAllocatorBlock *this_00;
  
  this_00 = in_RDI;
  do {
    *(undefined8 *)this_00 = 0;
    this_00 = (JitAllocatorBlock *)&this_00->field_0x8;
  } while (this_00 !=
           (JitAllocatorBlock *)&in_RDI->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock>);
  *(undefined8 *)&in_RDI->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
  *(undefined8 *)&in_RDI->field_0x18 = 0;
  in_RDI->_pool = in_RSI;
  (in_RDI->_mapping).rx = (void *)in_RDX;
  *(void **)((long)&in_RDI->_mapping + 8) = in_RCX;
  in_RDI->_blockSize = in_R8;
  in_RDI->_flags = in_R9D;
  in_RDI->_areaSize = in_stack_00000018;
  in_RDI->_areaUsed = 0;
  in_RDI->_largestUnusedArea = 0;
  in_RDI->_searchStart = 0;
  in_RDI->_searchEnd = 0;
  in_RDI->_usedBitVector = in_stack_00000008;
  in_RDI->_stopBitVector = in_stack_00000010;
  clearBlock(this_00);
  return;
}

Assistant:

inline JitAllocatorBlock(
    JitAllocatorPool* pool,
    VirtMem::DualMapping mapping,
    size_t blockSize,
    uint32_t blockFlags,
    Support::BitWord* usedBitVector,
    Support::BitWord* stopBitVector,
    uint32_t areaSize) noexcept
    : ZoneTreeNodeT(),
      _pool(pool),
      _mapping(mapping),
      _blockSize(blockSize),
      _flags(blockFlags),
      _areaSize(areaSize),
      _areaUsed(0),          // Will be initialized by clearBlock().
      _largestUnusedArea(0), // Will be initialized by clearBlock().
      _searchStart(0),       // Will be initialized by clearBlock().
      _searchEnd(0),         // Will be initialized by clearBlock().
      _usedBitVector(usedBitVector),
      _stopBitVector(stopBitVector) {

    clearBlock();
  }